

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::init
          (InterCallTestCase *this,EVP_PKEY_CTX *ctx)

{
  StorageType SVar1;
  Context *pCVar2;
  RenderContext *pRVar3;
  uint uVar4;
  bool *pbVar5;
  bool bVar6;
  ContextType ctxType;
  GLuint GVar7;
  mapped_type *pmVar8;
  ContextInfo *pCVar9;
  ostream *poVar10;
  ShaderProgram *pSVar11;
  pointer pCVar12;
  TestError *pTVar13;
  NotSupportedError *this_00;
  ContextInfo *pCVar14;
  char *pcVar15;
  char *pcVar16;
  ContextInfo *pCVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  CommandUnion *pCVar22;
  long lVar23;
  bool bVar24;
  ostringstream buf;
  int local_31c;
  string local_318;
  uint local_2f8;
  value_type local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2d0;
  Context *local_2c8;
  Context local_2b8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *local_2a0;
  long local_298;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *local_290;
  vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_> *local_288;
  undefined1 local_280 [16];
  undefined1 local_270 [104];
  ios_base local_208 [264];
  ProgramSources local_100;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((((!bVar6) && (this->m_useAtomic != false)) && (this->m_storage == STORAGE_IMAGE)) &&
     (bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_shader_image_atomic"), !bVar6)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_280._0_8_ = local_270;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_280,"Test requires GL_OES_shader_image_atomic extension","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_280);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_288 = &this->m_operationPrograms;
  local_280._0_8_ = (value_type)0x0;
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::resize
            (local_288,
             ((long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (value_type *)local_280);
  local_280._0_8_ = local_280._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_operationResultStorages,
             ((long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_cmds).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
             (value_type_conflict4 *)local_280);
  pCVar12 = (this->m_cmds).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_cmds).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12) >> 2) *
          -0x33333333) {
    local_2a0 = &local_100.attribLocationBindings;
    local_2d0 = &local_100.transformFeedbackVaryings;
    local_290 = &this->m_storageIDs;
    pCVar17 = (ContextInfo *)&(this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header;
    lVar21 = 0;
    local_31c = 0;
    local_2b8.m_contextInfo = pCVar17;
    do {
      local_298 = lVar21;
      switch(pCVar12[lVar21].type) {
      case TYPE_WRITE:
        pCVar22 = &pCVar12[lVar21].u_cmd;
        pCVar14 = (ContextInfo *)
                  (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        pCVar9 = pCVar17;
        if (pCVar14 != (ContextInfo *)0x0) {
          do {
            iVar19 = *(int *)&(pCVar14->m_extensions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((pCVar22->write).targetHandle <= iVar19) {
              pCVar9 = pCVar14;
            }
            pCVar14 = (ContextInfo *)
                      (&(pCVar14->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)
                      [iVar19 < (pCVar22->write).targetHandle];
          } while (pCVar14 != (ContextInfo *)0x0);
        }
        pcVar15 = (char *)pCVar17;
        if ((pCVar9 != pCVar17) &&
           (pcVar15 = (char *)pCVar9,
           (pCVar22->write).targetHandle <
           *(int *)&(pCVar9->m_extensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
          pcVar15 = (char *)pCVar17;
        }
        if ((ContextInfo *)pcVar15 == pCVar17) {
          GVar7 = genStorage(this,(pCVar22->write).targetHandle);
          pmVar8 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_290,&(pCVar22->readZero).targetHandle);
          *pmVar8 = GVar7;
        }
        iVar19 = pCVar12[lVar21].u_cmd.write.seed;
        bVar6 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar6 = (bVar6 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar16 = glcts::fixed_sample_locations_values + 1;
        if (bVar6) {
          pcVar16 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar21 = 0;
        if (bVar6) {
          lVar21 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar16,lVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar15 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar15 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=0) ",0xd);
          pcVar16 = "writeonly ";
          pcVar15 = "coherent ";
          if ((ulong)this->m_useAtomic != 0) {
            pcVar16 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar16,10 - (ulong)this->m_useAtomic);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar16 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar16 = "iimage2D";
          }
          lVar21 = 0xd;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar16,(ulong)this->m_formatInteger + 7);
          pcVar16 = " u_imageOut;\n";
LAB_014f860d:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar16,lVar21);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=0, std430) ",0x1a);
          pcVar15 = glcts::fixed_sample_locations_values + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar16 = "float";
          pcVar15 = "int";
          if (this->m_formatInteger != false) {
            pcVar16 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar21 = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar16 = "} sb_out;\n";
          goto LAB_014f860d;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size    = gl_NumWorkGroups * gl_WorkGroupSize;\n",
                   0x36);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx  = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar18 = 0;
            do {
              bVar6 = this->m_useAtomic != false;
              pcVar15 = "\t";
              if (bVar6) {
                pcVar15 = "\tatomicExchange(";
              }
              lVar21 = 1;
              if (bVar6) {
                lVar21 = 0x10;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_out.values[(groupNdx + ",0x1a);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  ((MessageBuilder *)local_280,
                                   this->m_invocationGridSize * iVar18 * this->m_invocationGridSize
                                   + iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,this->m_invocationGridSize * this->m_invocationGridSize *
                                           this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
              if (this->m_useAtomic == true) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,", ",2);
                pcVar16 = "float";
                pcVar15 = "int";
                if (this->m_formatInteger != false) {
                  pcVar16 = "int";
                }
                lVar21 = 0xd;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
                pcVar16 = "(groupNdx));\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," = ",3);
                pcVar16 = "float";
                pcVar15 = "int";
                if (this->m_formatInteger != false) {
                  pcVar16 = "int";
                }
                lVar21 = 0xc;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
                pcVar16 = "(groupNdx);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar16,lVar21);
              iVar18 = iVar18 + 1;
            } while (iVar18 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar18 = 0;
          do {
            pcVar16 = "\timageStore";
            pcVar15 = "\timageAtomicExchange";
            if ((ulong)this->m_useAtomic != 0) {
              pcVar16 = "\timageAtomicExchange";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,pcVar16,(ulong)this->m_useAtomic * 9 + 0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"(u_imageOut, ivec2((int(gl_GlobalInvocationID.x) + ",
                       0x33);
            poVar10 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_invocationGridSize);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,", int(gl_GlobalInvocationID.y) + ",0x21);
            poVar10 = (ostream *)
                      std::ostream::operator<<(poVar10,this->m_invocationGridSize * iVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"), ",3);
            bVar6 = this->m_formatInteger;
            if (this->m_useAtomic == true) {
              pcVar16 = "float";
              pcVar15 = "int";
              if (bVar6 != false) {
                pcVar16 = "int";
              }
              lVar23 = 0xd;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar16,(ulong)(bVar6 ^ 1) * 2 + 3);
              pcVar16 = "(groupNdx));\n";
            }
            else {
              pcVar16 = "vec4(float(groupNdx), 0.0, 0.0, 0.0)";
              if (bVar6 != false) {
                pcVar16 = "ivec4(int(groupNdx), 0, 0, 0)";
              }
              lVar21 = 0x24;
              if (bVar6 != false) {
                lVar21 = 0x1d;
              }
              lVar23 = 3;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar16,lVar21);
              pcVar16 = ");\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar16,lVar23);
            iVar18 = iVar18 + 1;
            iVar19 = iVar19 + 100;
          } while (iVar18 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar11 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        memset(&local_100,0,0xac);
        std::__cxx11::stringbuf::str();
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_318,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar15);
        local_2f8 = 5;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + local_2f8,&local_2f0);
        glu::ShaderProgram::ShaderProgram(pSVar11,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar21 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar21 = lVar21 + -0x18;
        } while (lVar21 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base((ios_base *)(local_270 + 0x60));
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar11);
        if ((pSVar11->m_program).m_info.linkOk == false) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_270;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar13,(string *)local_280);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        goto LAB_014f9bc4;
      case TYPE_READ:
        iVar19 = pCVar12[lVar21].u_cmd.write.seed;
        bVar6 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar6 = (bVar6 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar15 = glcts::fixed_sample_locations_values + 1;
        if (bVar6) {
          pcVar15 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar21 = 0;
        if (bVar6) {
          lVar21 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar15 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar15 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=1) ",0xd);
          pcVar15 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar15 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar15 = "iimage2D";
          }
          lVar21 = 0xc;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_formatInteger + 7);
          pcVar15 = " u_imageIn;\n";
LAB_014f88b6:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=1, std430) ",0x1a);
          pcVar15 = glcts::fixed_sample_locations_values + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar15 = "float";
          if (this->m_formatInteger != false) {
            pcVar15 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar21 = 9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar15 = "} sb_in;\n";
          goto LAB_014f88b6;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout(binding=0, std430) buffer ResultBuffer\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\thighp int resultOk[];\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"} sb_result;\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t",1);
        pcVar15 = "float";
        if (this->m_formatInteger != false) {
          pcVar15 = "int";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," zero = ",8);
        pcVar16 = "0.0";
        pcVar15 = "0";
        if (this->m_formatInteger != false) {
          pcVar16 = "0";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tbool allOk = true;\n",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar18 = 0;
            do {
              if (this->m_useAtomic == false) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,"\tallOk = allOk && (sb_in.values[(groupNdx + ",0x2c
                          );
                poVar10 = (ostream *)
                          std::ostream::operator<<
                                    ((MessageBuilder *)local_280,
                                     this->m_invocationGridSize * iVar18 *
                                     this->m_invocationGridSize + iVar19);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
                poVar10 = (ostream *)
                          std::ostream::operator<<
                                    (poVar10,this->m_invocationGridSize * this->m_invocationGridSize
                                             * this->m_perInvocationSize);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"] == ",5);
                pcVar16 = "float";
                pcVar15 = "int";
                if (this->m_formatInteger != false) {
                  pcVar16 = "int";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,
                           "\tallOk = allOk && (atomicExchange(sb_in.values[(groupNdx + ",0x3b);
                poVar10 = (ostream *)
                          std::ostream::operator<<
                                    ((MessageBuilder *)local_280,
                                     this->m_invocationGridSize * iVar18 *
                                     this->m_invocationGridSize + iVar19);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
                poVar10 = (ostream *)
                          std::ostream::operator<<
                                    (poVar10,this->m_invocationGridSize * this->m_invocationGridSize
                                             * this->m_perInvocationSize);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"], zero) == ",0xc);
                pcVar16 = "float";
                pcVar15 = "int";
                if (this->m_formatInteger != false) {
                  pcVar16 = "int";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(groupNdx));\n",0xd);
              iVar18 = iVar18 + 1;
            } while (iVar18 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar18 = 0;
          do {
            if (this->m_useAtomic == false) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,
                         "\tallOk = allOk && (imageLoad(u_imageIn, ivec2((gl_GlobalInvocationID.x + "
                         ,0x49);
              poVar10 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u) % ",5);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_invocationGridSize);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"u, gl_GlobalInvocationID.y + ",0x1d);
              poVar10 = (ostream *)
                        std::ostream::operator<<(poVar10,this->m_invocationGridSize * iVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u)).x == ",9);
              pcVar16 = "float";
              pcVar15 = "int";
              if (this->m_formatInteger != false) {
                pcVar16 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,
                         "\tallOk = allOk && (imageAtomicExchange(u_imageIn, ivec2((gl_GlobalInvocationID.x + "
                         ,0x53);
              poVar10 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u) % ",5);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_invocationGridSize);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"u, gl_GlobalInvocationID.y + ",0x1d);
              poVar10 = (ostream *)
                        std::ostream::operator<<(poVar10,this->m_invocationGridSize * iVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u), zero) == ",0xd);
              pcVar16 = "float";
              pcVar15 = "int";
              if (this->m_formatInteger != false) {
                pcVar16 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(groupNdx));\n",0xd);
            iVar18 = iVar18 + 1;
            iVar19 = iVar19 + 100;
          } while (iVar18 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar11 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        memset(&local_100,0,0xac);
        std::__cxx11::stringbuf::str();
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_318,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar15);
        local_2f8 = 5;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + local_2f8,&local_2f0);
        glu::ShaderProgram::ShaderProgram(pSVar11,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar21 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar21 = lVar21 + -0x18;
        } while (lVar21 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base((ios_base *)(local_270 + 0x60));
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar11);
        if ((pSVar11->m_program).m_info.linkOk == false) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_270;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar13,(string *)local_280);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        break;
      default:
        goto switchD_014f7203_caseD_2;
      case TYPE_READ_MULTIPLE:
        iVar19 = pCVar12[lVar21].u_cmd.write.seed;
        iVar18 = pCVar12[lVar21].u_cmd.readMulti.seed1;
        bVar6 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar6 = (bVar6 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar15 = glcts::fixed_sample_locations_values + 1;
        if (bVar6) {
          pcVar15 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar21 = 0;
        if (bVar6) {
          lVar21 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar15 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar15 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=1) ",0xd);
          pcVar15 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar15 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar15 = "iimage2D";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_formatInteger + 7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," u_imageIn0;\n",0xd);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar15 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar15 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=2) ",0xd);
          pcVar15 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar15 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar15 = "iimage2D";
          }
          lVar21 = 0xd;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_formatInteger + 7);
          pcVar15 = " u_imageIn1;\n";
LAB_014f7d97:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=1, std430) ",0x1a);
          pcVar15 = glcts::fixed_sample_locations_values + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer0\n",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar15 = "float";
          if (this->m_formatInteger != false) {
            pcVar15 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"} sb_in0;\n",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=2, std430) ",0x1a);
          pcVar15 = glcts::fixed_sample_locations_values + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer1\n",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar15 = "float";
          if (this->m_formatInteger != false) {
            pcVar15 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar21 = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar15 = "} sb_in1;\n";
          goto LAB_014f7d97;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout(binding=0, std430) buffer ResultBuffer\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\thighp int resultOk[];\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"} sb_result;\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t",1);
        pcVar15 = "float";
        if (this->m_formatInteger != false) {
          pcVar15 = "int";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," zero = ",8);
        pcVar16 = "0.0";
        pcVar15 = "0";
        if (this->m_formatInteger != false) {
          pcVar16 = "0";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tbool allOk = true;\n",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar20 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\tallOk = allOk && (",0x13);
              bVar6 = this->m_useAtomic != false;
              pbVar5 = glcts::fixed_sample_locations_values;
              if (bVar6) {
                pbVar5 = (bool *)"\tatomicExchange(";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pbVar5 + 1,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_in0.values[(groupNdx + ",0x1a);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  ((MessageBuilder *)local_280,
                                   this->m_invocationGridSize * iVar20 * this->m_invocationGridSize
                                   + iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,this->m_invocationGridSize * this->m_invocationGridSize *
                                           this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
              bVar6 = this->m_useAtomic != false;
              pcVar15 = glcts::fixed_sample_locations_values + 1;
              if (bVar6) {
                pcVar15 = ", zero)";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 7;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
              pcVar15 = "float";
              if (this->m_formatInteger != false) {
                pcVar15 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(groupNdx));\n",0xd);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"\tallOk = allOk && (",0x13);
              bVar6 = this->m_useAtomic != false;
              pbVar5 = glcts::fixed_sample_locations_values;
              if (bVar6) {
                pbVar5 = (bool *)"\tatomicExchange(";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pbVar5 + 1,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"sb_in1.values[(groupNdx + ",0x1a);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,this->m_invocationGridSize * iVar20 *
                                           this->m_invocationGridSize + iVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,this->m_invocationGridSize * this->m_invocationGridSize *
                                           this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
              bVar6 = this->m_useAtomic != false;
              pcVar15 = glcts::fixed_sample_locations_values + 1;
              if (bVar6) {
                pcVar15 = ", zero)";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 7;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
              pcVar16 = "float";
              pcVar15 = "int";
              if (this->m_formatInteger != false) {
                pcVar16 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(groupNdx));\n",0xd);
              iVar20 = iVar20 + 1;
            } while (iVar20 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar20 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"\tallOk = allOk && (",0x13);
            bVar6 = this->m_useAtomic != false;
            pcVar15 = "imageLoad";
            if (bVar6) {
              pcVar15 = "imageAtomicExchange";
            }
            lVar21 = 9;
            if (bVar6) {
              lVar21 = 0x13;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"(u_imageIn0, ivec2((gl_GlobalInvocationID.x + ",0x2e);
            poVar10 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u) % ",5);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_invocationGridSize);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"u, gl_GlobalInvocationID.y + ",0x1d);
            poVar10 = (ostream *)
                      std::ostream::operator<<(poVar10,this->m_invocationGridSize * iVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u)",2);
            pcVar15 = ").x";
            if (this->m_useAtomic != false) {
              pcVar15 = ", zero)";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,pcVar15,(ulong)this->m_useAtomic * 4 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
            pcVar15 = "float";
            if (this->m_formatInteger != false) {
              pcVar15 = "int";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(groupNdx));\n",0xd);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tallOk = allOk && (",0x13);
            bVar6 = this->m_useAtomic != false;
            pcVar15 = "imageLoad";
            if (bVar6) {
              pcVar15 = "imageAtomicExchange";
            }
            lVar21 = 9;
            if (bVar6) {
              lVar21 = 0x13;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar21);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"(u_imageIn1, ivec2((gl_GlobalInvocationID.x + ",0x2e);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u) % ",5);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_invocationGridSize);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"u, gl_GlobalInvocationID.y + ",0x1d);
            poVar10 = (ostream *)
                      std::ostream::operator<<(poVar10,this->m_invocationGridSize * iVar20);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u)",2);
            pcVar15 = ").x";
            if (this->m_useAtomic != false) {
              pcVar15 = ", zero)";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,pcVar15,(ulong)this->m_useAtomic * 4 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
            pcVar16 = "float";
            pcVar15 = "int";
            if (this->m_formatInteger != false) {
              pcVar16 = "int";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(groupNdx));\n",0xd);
            iVar20 = iVar20 + 1;
            iVar18 = iVar18 + 100;
            iVar19 = iVar19 + 100;
          } while (iVar20 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar11 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        memset(&local_100,0,0xac);
        std::__cxx11::stringbuf::str();
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_318,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar15);
        local_2f8 = 5;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + local_2f8,&local_2f0);
        glu::ShaderProgram::ShaderProgram(pSVar11,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar21 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar21 = lVar21 + -0x18;
        } while (lVar21 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base((ios_base *)(local_270 + 0x60));
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar11);
        if ((pSVar11->m_program).m_info.linkOk == false) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_270;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar13,(string *)local_280);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        break;
      case TYPE_WRITE_INTERLEAVE:
        pCVar22 = &pCVar12[lVar21].u_cmd;
        pCVar14 = (ContextInfo *)
                  (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        pCVar9 = pCVar17;
        if (pCVar14 != (ContextInfo *)0x0) {
          do {
            iVar19 = *(int *)&(pCVar14->m_extensions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((pCVar22->write).targetHandle <= iVar19) {
              pCVar9 = pCVar14;
            }
            pCVar14 = (ContextInfo *)
                      (&(pCVar14->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)
                      [iVar19 < (pCVar22->write).targetHandle];
          } while (pCVar14 != (ContextInfo *)0x0);
        }
        pcVar15 = (char *)pCVar17;
        if ((pCVar9 != pCVar17) &&
           (pcVar15 = (char *)pCVar9,
           (pCVar22->write).targetHandle <
           *(int *)&(pCVar9->m_extensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
          pcVar15 = (char *)pCVar17;
        }
        if ((ContextInfo *)pcVar15 == pCVar17) {
          GVar7 = genStorage(this,(pCVar22->write).targetHandle);
          pmVar8 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_290,&(pCVar22->readZero).targetHandle);
          *pmVar8 = GVar7;
        }
        iVar19 = pCVar12[lVar21].u_cmd.write.seed;
        bVar6 = pCVar12[lVar21].u_cmd.writeInterleave.evenOdd;
        bVar24 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar24 = (bVar24 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar16 = glcts::fixed_sample_locations_values + 1;
        if (bVar24) {
          pcVar16 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar21 = 0;
        if (bVar24) {
          lVar21 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar16,lVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar15 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar15 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=0) ",0xd);
          pcVar16 = "writeonly ";
          pcVar15 = "coherent ";
          if ((ulong)this->m_useAtomic != 0) {
            pcVar16 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar16,10 - (ulong)this->m_useAtomic);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar16 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar16 = "iimage2D";
          }
          lVar21 = 0xd;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar16,(ulong)this->m_formatInteger + 7);
          pcVar16 = " u_imageOut;\n";
LAB_014f8cb3:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar16,lVar21);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=0, std430) ",0x1a);
          pcVar15 = glcts::fixed_sample_locations_values + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar16 = "float";
          pcVar15 = "int";
          if (this->m_formatInteger != false) {
            pcVar16 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar21 = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar16 = "} sb_out;\n";
          goto LAB_014f8cb3;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size    = gl_NumWorkGroups * gl_WorkGroupSize;\n",
                   0x36);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx  = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        uVar4 = (uint)bVar6;
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar18 = 0;
            do {
              bVar6 = this->m_useAtomic != false;
              pcVar15 = "\t";
              if (bVar6) {
                pcVar15 = "\tatomicExchange(";
              }
              lVar21 = 1;
              if (bVar6) {
                lVar21 = 0x10;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_out.values[((groupNdx + ",0x1b);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  ((MessageBuilder *)local_280,
                                   (this->m_invocationGridSize * iVar18 * this->m_invocationGridSize
                                   ) / 2 + iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,((this->m_invocationGridSize * this->m_invocationGridSize
                                            ) / 2) * this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") * 2 + ",8);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar4 ^ 1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
              if (this->m_useAtomic == true) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,", ",2);
                pcVar16 = "float";
                pcVar15 = "int";
                if (this->m_formatInteger != false) {
                  pcVar16 = "int";
                }
                lVar21 = 0xd;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
                pcVar16 = "(groupNdx));\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"= ",2);
                pcVar16 = "float";
                pcVar15 = "int";
                if (this->m_formatInteger != false) {
                  pcVar16 = "int";
                }
                lVar21 = 0xc;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
                pcVar16 = "(groupNdx);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar16,lVar21);
              iVar18 = iVar18 + 1;
            } while (iVar18 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar18 = 0;
          do {
            pcVar16 = "\timageStore";
            pcVar15 = "\timageAtomicExchange";
            if ((ulong)this->m_useAtomic != 0) {
              pcVar16 = "\timageAtomicExchange";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,pcVar16,(ulong)this->m_useAtomic * 9 + 0xb);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"(u_imageOut, ivec2(((int(gl_GlobalInvocationID.x) + ",
                       0x34);
            poVar10 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_invocationGridSize / 2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,") * 2 + ",8);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar4 ^ 1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,", int(gl_GlobalInvocationID.y) + ",0x21);
            poVar10 = (ostream *)
                      std::ostream::operator<<(poVar10,this->m_invocationGridSize * iVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"), ",3);
            bVar6 = this->m_formatInteger;
            if (this->m_useAtomic == true) {
              pcVar16 = "float";
              pcVar15 = "int";
              if (bVar6 != false) {
                pcVar16 = "int";
              }
              lVar23 = 0xd;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar16,(ulong)(bVar6 ^ 1) * 2 + 3);
              pcVar16 = "(groupNdx));\n";
            }
            else {
              pcVar16 = "vec4(float(groupNdx), 0.0, 0.0, 0.0)";
              if (bVar6 != false) {
                pcVar16 = "ivec4(int(groupNdx), 0, 0, 0)";
              }
              lVar21 = 0x24;
              if (bVar6 != false) {
                lVar21 = 0x1d;
              }
              lVar23 = 3;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar16,lVar21);
              pcVar16 = ");\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar16,lVar23);
            iVar18 = iVar18 + 1;
            iVar19 = iVar19 + 100;
          } while (iVar18 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar11 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        memset(&local_100,0,0xac);
        std::__cxx11::stringbuf::str();
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_318,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar15);
        local_2f8 = 5;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + local_2f8,&local_2f0);
        glu::ShaderProgram::ShaderProgram(pSVar11,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar21 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar21 = lVar21 + -0x18;
        } while (lVar21 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base((ios_base *)(local_270 + 0x60));
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar11);
        if ((pSVar11->m_program).m_info.linkOk == false) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_270;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar13,(string *)local_280);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
LAB_014f9bc4:
        (local_288->super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>)
        ._M_impl.super__Vector_impl_data._M_start[local_298] = pSVar11;
        goto LAB_014fad58;
      case TYPE_READ_INTERLEAVE:
        iVar19 = pCVar12[lVar21].u_cmd.write.seed;
        iVar18 = pCVar12[lVar21].u_cmd.readMulti.targetHandle1;
        bVar6 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar6 = (bVar6 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar15 = glcts::fixed_sample_locations_values + 1;
        if (bVar6) {
          pcVar15 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar21 = 0;
        if (bVar6) {
          lVar21 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar15 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar15 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=1) ",0xd);
          pcVar15 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar15 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar15 = "iimage2D";
          }
          lVar21 = 0xc;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_formatInteger + 7);
          pcVar15 = " u_imageIn;\n";
LAB_014f8f93:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=1, std430) ",0x1a);
          pcVar15 = glcts::fixed_sample_locations_values + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar15 = "float";
          if (this->m_formatInteger != false) {
            pcVar15 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar21 = 9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar15 = "} sb_in;\n";
          goto LAB_014f8f93;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout(binding=0, std430) buffer ResultBuffer\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\thighp int resultOk[];\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"} sb_result;\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint interleavedGroupNdx = int((size.x >> 1U) * size.y * gl_GlobalInvocationID.z + (size.x >> 1U) * gl_GlobalInvocationID.y + (gl_GlobalInvocationID.x >> 1U));\n"
                   ,0xa0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t",1);
        pcVar15 = "float";
        if (this->m_formatInteger != false) {
          pcVar15 = "int";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," zero = ",8);
        pcVar16 = "0.0";
        pcVar15 = "0";
        if (this->m_formatInteger != false) {
          pcVar16 = "0";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tbool allOk = true;\n",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"\tif (groupNdx % 2 == 0)\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t{\n",3);
          if (0 < this->m_perInvocationSize) {
            iVar20 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\t\tallOk = allOk && (",0x14);
              bVar6 = this->m_useAtomic != false;
              pcVar15 = "imageLoad";
              if (bVar6) {
                pcVar15 = "imageAtomicExchange";
              }
              lVar21 = 9;
              if (bVar6) {
                lVar21 = 0x13;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,
                         "(u_imageIn, ivec2(((int(gl_GlobalInvocationID.x >> 1U) + ",0x39);
              poVar10 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_invocationGridSize / 2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,") * 2 + 0, int(gl_GlobalInvocationID.y) + ",0x2a);
              poVar10 = (ostream *)
                        std::ostream::operator<<(poVar10,this->m_invocationGridSize * iVar20);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
              pcVar15 = ").x";
              if (this->m_useAtomic != false) {
                pcVar15 = ", zero)";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar15,(ulong)this->m_useAtomic * 4 + 3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
              pcVar16 = "float";
              pcVar15 = "int";
              if (this->m_formatInteger != false) {
                pcVar16 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"(interleavedGroupNdx));\n",0x18);
              iVar20 = iVar20 + 1;
              iVar19 = iVar19 + 100;
            } while (iVar20 < this->m_perInvocationSize);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t}\n",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\telse\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t{\n",3);
          if (0 < this->m_perInvocationSize) {
            iVar19 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\t\tallOk = allOk && (",0x14);
              bVar6 = this->m_useAtomic != false;
              pcVar15 = "imageLoad";
              if (bVar6) {
                pcVar15 = "imageAtomicExchange";
              }
              lVar21 = 9;
              if (bVar6) {
                lVar21 = 0x13;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,
                         "(u_imageIn, ivec2(((int(gl_GlobalInvocationID.x >> 1U) + ",0x39);
              poVar10 = (ostream *)std::ostream::operator<<((MessageBuilder *)local_280,iVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->m_invocationGridSize / 2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,") * 2 + 1, int(gl_GlobalInvocationID.y) + ",0x2a);
              poVar10 = (ostream *)
                        std::ostream::operator<<(poVar10,this->m_invocationGridSize * iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
              pcVar15 = ").x";
              if (this->m_useAtomic != false) {
                pcVar15 = ", zero)";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar15,(ulong)this->m_useAtomic * 4 + 3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
              pcVar16 = "float";
              pcVar15 = "int";
              if (this->m_formatInteger != false) {
                pcVar16 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"(interleavedGroupNdx));\n",0x18);
              iVar19 = iVar19 + 1;
              iVar18 = iVar18 + 100;
            } while (iVar19 < this->m_perInvocationSize);
          }
LAB_014fa639:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t}\n",3);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"\tif (groupNdx % 2 == 0)\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t{\n",3);
          if (0 < this->m_perInvocationSize) {
            iVar20 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\t\tallOk = allOk && (",0x14);
              bVar6 = this->m_useAtomic != false;
              pbVar5 = glcts::fixed_sample_locations_values;
              if (bVar6) {
                pbVar5 = (bool *)"\tatomicExchange(";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pbVar5 + 1,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_in.values[((interleavedGroupNdx + ",0x25);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  ((MessageBuilder *)local_280,
                                   (this->m_invocationGridSize * iVar20 * this->m_invocationGridSize
                                   ) / 2 + iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,(this->m_invocationGridSize * this->m_invocationGridSize
                                           * this->m_perInvocationSize) / 2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") * 2 + 0]",10);
              bVar6 = this->m_useAtomic != false;
              pcVar15 = glcts::fixed_sample_locations_values + 1;
              if (bVar6) {
                pcVar15 = ", zero)";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 7;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
              pcVar16 = "float";
              pcVar15 = "int";
              if (this->m_formatInteger != false) {
                pcVar16 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"(interleavedGroupNdx));\n",0x18);
              iVar20 = iVar20 + 1;
            } while (iVar20 < this->m_perInvocationSize);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t}\n",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\telse\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t{\n",3);
          if (0 < this->m_perInvocationSize) {
            iVar19 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\t\tallOk = allOk && (",0x14);
              bVar6 = this->m_useAtomic != false;
              pbVar5 = glcts::fixed_sample_locations_values;
              if (bVar6) {
                pbVar5 = (bool *)"\tatomicExchange(";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pbVar5 + 1,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_in.values[((interleavedGroupNdx + ",0x25);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  ((MessageBuilder *)local_280,
                                   (this->m_invocationGridSize * iVar19 * this->m_invocationGridSize
                                   ) / 2 + iVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") % ",4);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  (poVar10,(this->m_invocationGridSize * this->m_invocationGridSize
                                           * this->m_perInvocationSize) / 2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,") * 2 + 1]",10);
              bVar6 = this->m_useAtomic != false;
              pcVar15 = glcts::fixed_sample_locations_values + 1;
              if (bVar6) {
                pcVar15 = ", zero)";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 7;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
              pcVar16 = "float";
              pcVar15 = "int";
              if (this->m_formatInteger != false) {
                pcVar16 = "int";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,"(interleavedGroupNdx));\n",0x18);
              iVar19 = iVar19 + 1;
            } while (iVar19 < this->m_perInvocationSize);
          }
          goto LAB_014fa639;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar11 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        memset(&local_100,0,0xac);
        std::__cxx11::stringbuf::str();
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_318,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar15);
        local_2f8 = 5;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + local_2f8,&local_2f0);
        glu::ShaderProgram::ShaderProgram(pSVar11,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar21 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar21 = lVar21 + -0x18;
        } while (lVar21 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base((ios_base *)(local_270 + 0x60));
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar11);
        if ((pSVar11->m_program).m_info.linkOk == false) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_270;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar13,(string *)local_280);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        break;
      case TYPE_READ_ZERO:
        pCVar22 = &pCVar12[lVar21].u_cmd;
        pCVar14 = (ContextInfo *)
                  (this->m_storageIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        pCVar9 = pCVar17;
        if (pCVar14 != (ContextInfo *)0x0) {
          do {
            iVar19 = *(int *)&(pCVar14->m_extensions).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if ((pCVar22->write).targetHandle <= iVar19) {
              pCVar9 = pCVar14;
            }
            pCVar14 = (ContextInfo *)
                      (&(pCVar14->m_extensions).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)
                      [iVar19 < (pCVar22->write).targetHandle];
          } while (pCVar14 != (ContextInfo *)0x0);
        }
        pCVar14 = pCVar17;
        if ((pCVar9 != pCVar17) &&
           (pCVar14 = pCVar9,
           (pCVar22->write).targetHandle <
           *(int *)&(pCVar9->m_extensions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
          pCVar14 = pCVar17;
        }
        if (pCVar14 == pCVar17) {
          GVar7 = genStorage(this,(pCVar22->write).targetHandle);
          pmVar8 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_290,&(pCVar22->readZero).targetHandle);
          *pmVar8 = GVar7;
        }
        bVar6 = this->m_useAtomic;
        SVar1 = this->m_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"${GLSL_VERSION_DECL}\n",0x15);
        bVar6 = (bVar6 & SVar1 == STORAGE_IMAGE) != 0;
        pcVar15 = glcts::fixed_sample_locations_values + 1;
        if (bVar6) {
          pcVar15 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
        }
        lVar21 = 0;
        if (bVar6) {
          lVar21 = 0x1f;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout (local_size_x = 1, local_size_y = 1) in;\n",0x30);
        if (this->m_storage == STORAGE_IMAGE) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"layout(",7);
          pcVar15 = "r32f";
          if (this->m_formatInteger != false) {
            pcVar15 = "r32i";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,", binding=1) ",0xd);
          pcVar15 = "readonly ";
          if (this->m_useAtomic != false) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"uniform highp ",0xe);
          pcVar15 = "image2D";
          if ((ulong)this->m_formatInteger != 0) {
            pcVar15 = "iimage2D";
          }
          lVar21 = 0xc;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_formatInteger + 7);
          pcVar15 = " u_imageIn;\n";
LAB_014f8298:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"layout(binding=1, std430) ",0x1a);
          pcVar15 = glcts::fixed_sample_locations_values + 1;
          if ((ulong)this->m_useAtomic != 0) {
            pcVar15 = "coherent ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)this->m_useAtomic * 9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,"buffer Buffer\n",0xe);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\thighp ",7);
          pcVar15 = "float";
          if (this->m_formatInteger != false) {
            pcVar15 = "int";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
          lVar21 = 9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_280," values[];\n",0xb);
          pcVar15 = "} sb_in;\n";
          goto LAB_014f8298;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"layout(binding=0, std430) buffer ResultBuffer\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\thighp int resultOk[];\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"} sb_result;\n",0xd);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"void main (void)\n",0x11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tuvec3 size = gl_NumWorkGroups * gl_WorkGroupSize;\n",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,
                   "\tint groupNdx = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                   ,0x7b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\t",1);
        pcVar15 = "float";
        if (this->m_formatInteger != false) {
          pcVar15 = "int";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar15,(ulong)(this->m_formatInteger ^ 1) * 2 + 3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280," anything = ",0xc);
        pcVar16 = "5.0";
        pcVar15 = "5";
        if (this->m_formatInteger != false) {
          pcVar16 = "5";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tbool allOk = true;\n",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"\n",1);
        if (this->m_storage == STORAGE_BUFFER) {
          if (0 < this->m_perInvocationSize) {
            iVar19 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"\tallOk = allOk && (",0x13);
              bVar6 = this->m_useAtomic != false;
              pbVar5 = glcts::fixed_sample_locations_values;
              if (bVar6) {
                pbVar5 = (bool *)"\tatomicExchange(";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 0xf;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,pbVar5 + 1,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_280,"sb_in.values[groupNdx * ",0x18);
              poVar10 = (ostream *)
                        std::ostream::operator<<
                                  ((MessageBuilder *)local_280,this->m_perInvocationSize);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," + ",3);
              poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
              bVar6 = this->m_useAtomic != false;
              pcVar15 = glcts::fixed_sample_locations_values + 1;
              if (bVar6) {
                pcVar15 = ", anything)";
              }
              lVar21 = 0;
              if (bVar6) {
                lVar21 = 0xb;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
              pcVar16 = "0.0";
              pcVar15 = "0";
              if (this->m_formatInteger != false) {
                pcVar16 = "0";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
              iVar19 = iVar19 + 1;
            } while (iVar19 < this->m_perInvocationSize);
          }
        }
        else if ((this->m_storage == STORAGE_IMAGE) && (0 < this->m_perInvocationSize)) {
          iVar19 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,"\tallOk = allOk && (",0x13);
            bVar6 = this->m_useAtomic != false;
            pcVar15 = "imageLoad";
            if (bVar6) {
              pcVar15 = "imageAtomicExchange";
            }
            lVar21 = 9;
            if (bVar6) {
              lVar21 = 0x13;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,pcVar15,lVar21);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_280,
                       "(u_imageIn, ivec2(gl_GlobalInvocationID.x, gl_GlobalInvocationID.y + ",0x45)
            ;
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                ((MessageBuilder *)local_280,this->m_invocationGridSize * iVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"u)",2);
            pcVar15 = ").x";
            if (this->m_useAtomic != false) {
              pcVar15 = ", anything)";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,pcVar15,(ulong)this->m_useAtomic * 8 + 3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," == ",4);
            pcVar16 = "0.0";
            pcVar15 = "0";
            if (this->m_formatInteger != false) {
              pcVar16 = "0";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,pcVar16,(ulong)(this->m_formatInteger ^ 1) * 2 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
            iVar19 = iVar19 + 1;
          } while (iVar19 < this->m_perInvocationSize);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280,"\tsb_result.resultOk[groupNdx] = (allOk) ? (1) : (0);\n",
                   0x35);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_280,"}\n",2);
        pSVar11 = (ShaderProgram *)operator_new(0xd0);
        pCVar2 = (this->super_TestCase).m_context;
        pRVar3 = pCVar2->m_renderCtx;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(local_2d0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2d0->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        memset(&local_100,0,0xac);
        std::__cxx11::stringbuf::str();
        Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                  (&local_318,(_anonymous_namespace_ *)pCVar2,local_2c8,pcVar15);
        local_2f8 = 5;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_100.sources + local_2f8,&local_2f0);
        glu::ShaderProgram::ShaderProgram(pSVar11,pRVar3,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,(ulong)((long)&(local_2b8.m_testCtx)->m_platform + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_2d0);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(local_2a0);
        lVar21 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_100.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar21 = lVar21 + -0x18;
        } while (lVar21 != -0x18);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        std::ios_base::~ios_base((ios_base *)(local_270 + 0x60));
        local_280._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_280 + 8),"Program #",9)
        ;
        std::ostream::operator<<(local_280 + 8,local_31c + 1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 8));
        std::ios_base::~ios_base(local_208);
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar11);
        if ((pSVar11->m_program).m_info.linkOk == false) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          local_280._0_8_ = local_270;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_280,"could not build program","");
          tcu::TestError::TestError(pTVar13,(string *)local_280);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      lVar21 = local_298;
      (this->m_operationPrograms).
      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
      super__Vector_impl_data._M_start[local_298] = pSVar11;
      GVar7 = genResultStorage(this);
      (this->m_operationResultStorages).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar21] = GVar7;
      local_298 = lVar21;
LAB_014fad58:
      local_31c = local_31c + 1;
      pCVar17 = local_2b8.m_contextInfo;
switchD_014f7203_caseD_2:
      lVar21 = local_298 + 1;
      pCVar12 = (this->m_cmds).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar21 < (int)((ulong)((long)(this->m_cmds).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar12
                                   ) >> 2) * -0x33333333);
  }
  return (int)pCVar12;
}

Assistant:

void InterCallTestCase::init (void)
{
	int			programFriendlyName = 0;
	const bool	supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (m_useAtomic && m_storage == STORAGE_IMAGE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic extension");

	// generate resources and validate command list

	m_operationPrograms.resize(m_cmds.size(), DE_NULL);
	m_operationResultStorages.resize(m_cmds.size(), 0);

	for (int step = 0; step < (int)m_cmds.size(); ++step)
	{
		switch (m_cmds[step].type)
		{
			case InterCallOperations::Command::TYPE_WRITE:
			{
				const op::WriteData& cmd = m_cmds[step].u_cmd.write;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genWriteProgram(cmd.seed);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ:
			{
				const op::ReadData& cmd = m_cmds[step].u_cmd.read;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle) != m_storageIDs.end());

				// program and result storage
				{
					glu::ShaderProgram* program = genReadProgram(cmd.seed);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_BARRIER:
			{
				break;
			}

			case InterCallOperations::Command::TYPE_READ_MULTIPLE:
			{
				const op::ReadMultipleData& cmd = m_cmds[step].u_cmd.readMulti;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle0) != m_storageIDs.end());
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle1) != m_storageIDs.end());

				// program
				{
					glu::ShaderProgram* program = genReadMultipleProgram(cmd.seed0, cmd.seed1);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_WRITE_INTERLEAVE:
			{
				const op::WriteDataInterleaved& cmd = m_cmds[step].u_cmd.writeInterleave;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genWriteInterleavedProgram(cmd.seed, cmd.evenOdd);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ_INTERLEAVE:
			{
				const op::ReadDataInterleaved& cmd = m_cmds[step].u_cmd.readInterleave;
				DE_ASSERT(m_storageIDs.find(cmd.targetHandle) != m_storageIDs.end());

				// program
				{
					glu::ShaderProgram* program = genReadInterleavedProgram(cmd.seed0, cmd.seed1);

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			case InterCallOperations::Command::TYPE_READ_ZERO:
			{
				const op::ReadZeroData& cmd = m_cmds[step].u_cmd.readZero;

				// new storage handle?
				if (m_storageIDs.find(cmd.targetHandle) == m_storageIDs.end())
					m_storageIDs[cmd.targetHandle] = genStorage(cmd.targetHandle);

				// program
				{
					glu::ShaderProgram* program = genReadZeroProgram();

					m_testCtx.getLog() << tcu::TestLog::Message << "Program #" << ++programFriendlyName << tcu::TestLog::EndMessage;
					m_testCtx.getLog() << *program;

					if (!program->isOk())
						throw tcu::TestError("could not build program");

					m_operationPrograms[step] = program;
					m_operationResultStorages[step] = genResultStorage();
				}
				break;
			}

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}